

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::lexer::token_type_name(string *__return_storage_ptr__,token_type t)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(t) {
  case uninitialized:
    __s = "<uninitialized>";
    __a = &local_9;
    break;
  case literal_true:
    __s = "true literal";
    __a = &local_a;
    break;
  case literal_false:
    __s = "false literal";
    __a = &local_b;
    break;
  case literal_null:
    __s = "null literal";
    __a = &local_c;
    break;
  case value_string:
    __s = "string literal";
    __a = &local_d;
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    __s = "number literal";
    __a = &local_e;
    break;
  case begin_array:
    __s = "\'[\'";
    __a = &local_f;
    break;
  case begin_object:
    __s = "\'{\'";
    __a = &local_10;
    break;
  case end_array:
    __s = "\']\'";
    __a = &local_11;
    break;
  case end_object:
    __s = "\'}\'";
    __a = &local_12;
    break;
  case name_separator:
    __s = "\':\'";
    __a = &local_13;
    break;
  case value_separator:
    __s = "\',\'";
    __a = &local_14;
    break;
  case parse_error:
    __s = "<parse error>";
    __a = &local_15;
    break;
  case end_of_input:
    __s = "end of input";
    __a = &local_16;
    break;
  default:
    __s = "unknown token";
    __a = &local_17;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static std::string token_type_name(const token_type t)
			{
				switch (t)
				{
				case token_type::uninitialized:
					return "<uninitialized>";
				case token_type::literal_true:
					return "true literal";
				case token_type::literal_false:
					return "false literal";
				case token_type::literal_null:
					return "null literal";
				case token_type::value_string:
					return "string literal";
				case lexer::token_type::value_unsigned:
				case lexer::token_type::value_integer:
				case lexer::token_type::value_float:
					return "number literal";
				case token_type::begin_array:
					return "'['";
				case token_type::begin_object:
					return "'{'";
				case token_type::end_array:
					return "']'";
				case token_type::end_object:
					return "'}'";
				case token_type::name_separator:
					return "':'";
				case token_type::value_separator:
					return "','";
				case token_type::parse_error:
					return "<parse error>";
				case token_type::end_of_input:
					return "end of input";
				default:
				{
					// catch non-enum values
					return "unknown token"; // LCOV_EXCL_LINE
				}
				}
			}